

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

VertexId __thiscall
S2Builder::EdgeChainSimplifier::FollowChain(EdgeChainSimplifier *this,VertexId v0,VertexId v1)

{
  int iVar1;
  pointer piVar2;
  const_reference cVar3;
  long lVar4;
  size_type __n;
  S2LogMessage local_30;
  
  __n = (size_type)v1;
  cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->is_interior_,__n);
  if (cVar3) {
    piVar2 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)piVar2[__n];
    while (piVar2[__n + 1] != lVar4) {
      iVar1 = (this->g_->edges_->
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
              _M_impl.super__Vector_impl_data._M_start[lVar4].second;
      lVar4 = lVar4 + 1;
      if (iVar1 != v1 && iVar1 != v0) {
        return iVar1;
      }
    }
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0x641,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_30.stream_,"Could not find next edge in edge chain");
  }
  else {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0x63c,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_30.stream_,"Check failed: is_interior_[v1] ");
  }
  abort();
}

Assistant:

S2Builder::Graph::VertexId S2Builder::EdgeChainSimplifier::FollowChain(
    VertexId v0, VertexId v1) const {
  S2_DCHECK(is_interior_[v1]);
  for (EdgeId e : out_.edge_ids(v1)) {
    VertexId v = g_.edge(e).second;
    if (v != v0 && v != v1) return v;
  }
  S2_LOG(FATAL) << "Could not find next edge in edge chain";
}